

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  char cVar1;
  cmGeneratedFileStream *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  ostream *poVar5;
  
  if (msg == (char *)0x0) {
    return;
  }
  if (logType != 6 && suppress) {
    return;
  }
  if (*msg == '\0') {
    return;
  }
  if (logType == 3) {
    if (this->Debug != false) {
      return;
    }
    if (this->ExtraVerbose != false) {
      return;
    }
  }
  pcVar2 = this->OutputLogFile;
  if ((pcVar2 != (cmGeneratedFileStream *)0x0) &&
     (((logType != 0 | this->Debug) & (logType != 4 | this->Debug | this->ExtraVerbose) & 1U) != 0))
  {
    if (this->ShowLineNumbers == true) {
      std::ios::widen((char)(pcVar2->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3] + (char)pcVar2);
      std::ostream::put((char)pcVar2);
      poVar3 = (ostream *)std::ostream::flush();
      if (file == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,file,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    }
    if (this->OutputLogFileLastTag != logType) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->OutputLogFile,"[",1);
      if ((uint)logType < 7) {
        std::operator<<((ostream *)this->OutputLogFile,cmCTestStringLogType[(uint)logType]);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->OutputLogFile,"OTHER",5)
        ;
      }
      pcVar2 = this->OutputLogFile;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"] ",2);
      std::ios::widen((char)(pcVar2->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3] + (char)pcVar2);
      std::ostream::put((char)pcVar2);
      std::ostream::flush();
      std::ostream::flush();
    }
    pcVar2 = this->OutputLogFile;
    sVar4 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,msg,sVar4);
    std::ostream::flush();
    if (this->OutputLogFileLastTag != logType) {
      cVar1 = (char)this->OutputLogFile;
      std::ios::widen((char)(this->OutputLogFile->super_ofstream).
                            super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                            [-3] + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::ostream::flush();
      this->OutputLogFileLastTag = logType;
    }
  }
  if (this->Quiet != false) {
    return;
  }
  poVar3 = this->StreamOut;
  if ((uint)logType < 7) {
    poVar5 = this->StreamErr;
    switch(logType) {
    case 0:
      cVar1 = this->Debug;
joined_r0x00282f8c:
      if (cVar1 != '\x01') {
        return;
      }
      break;
    default:
      if (this->Debug == false) {
        cVar1 = this->Verbose;
        goto joined_r0x00282f8c;
      }
      break;
    case 3:
      break;
    case 4:
      if (this->Debug == false) {
        cVar1 = this->ExtraVerbose;
        goto joined_r0x00282f8c;
      }
      break;
    case 5:
      if (this->ShowLineNumbers == true) {
        poVar3 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar3 = std::operator<<(poVar3,file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      }
      sVar4 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,msg,sVar4);
      goto LAB_0028306d;
    case 6:
      if (this->ShowLineNumbers == true) {
        poVar3 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar3 = std::operator<<(poVar3,file);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      }
      sVar4 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,msg,sVar4);
      std::ostream::flush();
      cmSystemTools::s_ErrorOccured = true;
      return;
    }
  }
  if (this->ShowLineNumbers == true) {
    poVar5 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar5 = std::operator<<(poVar5,file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  }
  sVar4 = strlen(msg);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,msg,sVar4);
LAB_0028306d:
  std::ostream::flush();
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Debug || this->ExtraVerbose)) {
    return;
  }
  if (this->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Debug &&
        !this->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->OutputLogFile);
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->OutputLogFile << "OTHER";
        } else {
          *this->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->OutputLogFile << "] " << std::endl << std::flush;
      }
      *this->OutputLogFile << msg << std::flush;
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << std::endl << std::flush;
        this->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Quiet) {
    std::ostream& out = *this->StreamOut;
    std::ostream& err = *this->StreamErr;
    switch (logType) {
      case DEBUG:
        if (this->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Debug || this->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Debug || this->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccured();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}